

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar6;
  undefined8 uVar5;
  undefined4 uVar7;
  pointer pMVar8;
  unsigned_long uVar9;
  void *pvVar10;
  uint uVar11;
  bool bVar12;
  pointer pvVar13;
  ulong uVar14;
  pointer __n;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  int *piVar18;
  pointer pfVar19;
  int iVar20;
  int iVar21;
  pointer pBVar22;
  ulong uVar23;
  int q;
  pointer pBVar24;
  ulong uVar25;
  size_t i_2;
  int j;
  Mat *pMVar26;
  int i;
  long lVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined4 extraout_XMM0_Db;
  float fVar35;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 in_XMM1 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uint local_238;
  int iStack_234;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  int local_19c;
  size_t local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  pointer local_110;
  pointer local_108;
  pointer local_100;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  float local_d8;
  float fStack_d4;
  
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar17 = 0;
  do {
    pMVar8 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 6) <= uVar17) {
      if (all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
          .super__Vector_impl_data._M_start !=
          all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        if (all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          qsort_descent_inplace<ncnn::BBoxRect>
                    (&all_bbox_rects,&all_bbox_scores,0,
                     (int)((ulong)((long)all_bbox_scores.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)all_bbox_scores.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2) + -1);
        }
      }
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fVar28 = this->nms_threshold;
      __n = (pointer)(((long)all_bbox_rects.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)all_bbox_rects.
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x14);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&bbox_rects,(size_type)__n,
                 (allocator_type *)&bbox_scores);
      pfVar15 = &(all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start)->xmax;
      for (pfVar19 = (pointer)0x0; __n != pfVar19; pfVar19 = (pointer)((long)pfVar19 + 1)) {
        uVar4 = ((BBoxRect *)(pfVar15 + -2))->xmin;
        uVar7 = ((BBoxRect *)(pfVar15 + -2))->ymin;
        (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start)->xmin)[(long)pfVar19] =
             ((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) - (float)uVar7) *
             ((float)*(undefined8 *)pfVar15 - (float)uVar4);
        pfVar15 = pfVar15 + 5;
      }
      for (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start = (pointer)0x0;
          bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start < __n;
          bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl
                               .super__Vector_impl_data._M_start + 1)) {
        pBVar24 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
        uVar17 = (ulong)((long)picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)picked.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3;
        uVar14 = uVar17 & 0xffffffff;
        if ((int)uVar17 < 1) {
          uVar14 = 0;
        }
        bVar12 = true;
        for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
          uVar9 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17];
          fVar34 = pBVar24->xmin;
          fVar36 = all_bbox_rects.
                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9].xmax;
          fVar33 = 0.0;
          if (fVar34 <= fVar36) {
            pBVar22 = all_bbox_rects.
                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar9;
            fVar29 = pBVar24->xmax;
            fVar30 = pBVar22->xmin;
            if (fVar30 <= fVar29) {
              fVar31 = pBVar24->ymin;
              fVar32 = pBVar22->ymax;
              if (fVar31 <= fVar32) {
                fVar35 = pBVar24->ymax;
                fVar37 = pBVar22->ymin;
                if (fVar37 <= fVar35) {
                  if (fVar29 <= fVar36) {
                    fVar36 = fVar29;
                  }
                  if (fVar30 <= fVar34) {
                    fVar30 = fVar34;
                  }
                  if (fVar35 <= fVar32) {
                    fVar32 = fVar35;
                  }
                  if (fVar37 <= fVar31) {
                    fVar37 = fVar31;
                  }
                  fVar33 = (fVar32 - fVar37) * (fVar36 - fVar30);
                }
              }
            }
          }
          if (fVar28 < fVar33 / (((&(bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->xmin)
                                  [(long)bbox_scores.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start] - fVar33) +
                                (&(bbox_rects.
                                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->xmin)[uVar9])) {
            bVar12 = false;
          }
        }
        if (bVar12) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&picked,(value_type_conflict5 *)&bbox_scores);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (uVar17 = 0;
          uVar17 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar17 = uVar17 + 1
          ) {
        uVar9 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17];
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  (&bbox_rects,
                   all_bbox_rects.
                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9);
        std::vector<float,_std::allocator<float>_>::push_back
                  (&bbox_scores,
                   all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9);
      }
      uVar17 = ((long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x14;
      iVar20 = (int)uVar17;
      if (iVar20 == 0) {
        iVar6 = 0;
      }
      else {
        pMVar26 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        Mat::create(pMVar26,6,iVar20,4,opt->blob_allocator);
        pvVar10 = pMVar26->data;
        iVar6 = -100;
        if ((pvVar10 != (void *)0x0) && ((long)pMVar26->c * pMVar26->cstep != 0)) {
          iVar6 = 0;
          uVar17 = uVar17 & 0xffffffff;
          if (iVar20 < 1) {
            uVar17 = 0;
          }
          piVar18 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_start)->label;
          for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
            fVar28 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
            lVar16 = (long)(int)uVar14 * (long)pMVar26->w * pMVar26->elemsize;
            *(float *)((long)pvVar10 + lVar16) = (float)(*piVar18 + 1);
            *(float *)((long)pvVar10 + lVar16 + 4) = fVar28;
            *(float *)((long)pvVar10 + lVar16 + 8) = ((BBoxRect *)(piVar18 + -4))->xmin;
            *(int *)((long)pvVar10 + lVar16 + 0xc) = piVar18[-3];
            *(int *)((long)pvVar10 + lVar16 + 0x10) = piVar18[-2];
            *(int *)((long)pvVar10 + lVar16 + 0x14) = piVar18[-1];
            piVar18 = piVar18 + 5;
          }
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_0015f41c:
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                (&all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                );
      return iVar6;
    }
    iVar20 = pMVar8[uVar17].c / this->num_box;
    if (iVar20 != this->num_class + 5) {
      iVar6 = -1;
      goto LAB_0015f41c;
    }
    uVar3 = pMVar8[uVar17].w;
    iVar6 = pMVar8[uVar17].h;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)&bbox_scores,(long)this->num_box);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&all_box_bbox_scores,(long)this->num_box);
    pMVar26 = pMVar8 + uVar17;
    fVar28 = (float)(int)uVar3;
    fVar34 = (float)iVar6;
    auVar39._4_4_ = fVar34;
    auVar39._0_4_ = fVar28;
    auVar39._8_8_ = 0;
    auVar39 = rcpps(in_XMM1,auVar39);
    fVar36 = auVar39._0_4_;
    fVar33 = auVar39._4_4_;
    uVar11 = uVar3;
    if ((int)uVar3 < 1) {
      uVar11 = 0;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    in_XMM1 = ZEXT416((uint)(1.0 / fVar34));
    lVar16 = 0;
    while( true ) {
      uVar14 = (ulong)this->num_box;
      if ((long)uVar14 <= lVar16) break;
      iVar21 = (int)lVar16 * iVar20;
      uVar5 = *(undefined8 *)((long)(this->biases).data + lVar16 * 8);
      Mat::channel((Mat *)&bbox_rects,pMVar26,iVar21);
      pBVar24 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar26,iVar21 + 1);
      pBVar22 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar26,iVar21 + 2);
      local_100 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar26,iVar21 + 3);
      local_108 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar26,iVar21 + 4);
      local_110 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel_range((Mat *)&bbox_rects,pMVar26,iVar21 + 5,this->num_class);
      (*this->softmax->_vptr_Layer[9])(this->softmax,(Mat *)&bbox_rects,opt);
      local_d8 = (float)uVar5;
      fStack_d4 = (float)((ulong)uVar5 >> 0x20);
      for (iVar21 = 0; iVar21 != iVar6; iVar21 = iVar21 + 1) {
        for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
          fVar29 = expf(-pBVar24->xmin);
          fVar30 = expf(-pBVar22->xmin);
          fVar31 = ((float)(int)uVar14 + 1.0 / (fVar29 + 1.0)) * (1.0 / fVar28);
          fVar29 = local_100->xmin;
          fVar32 = expf(local_108->xmin);
          fVar29 = expf(fVar29);
          fVar29 = fVar29 * local_d8 * 0.5 * ((1.0 - fVar28 * fVar36) * fVar36 + fVar36);
          fVar35 = fVar32 * fStack_d4 * 0.5 * ((1.0 - fVar34 * fVar33) * fVar33 + fVar33);
          fVar37 = fVar31 + fVar29;
          fVar32 = expf(-local_110->xmin);
          auVar39 = ZEXT816(0);
          uVar23 = 0;
          for (uVar25 = 0; fVar38 = auVar39._0_4_, (long)uVar25 < (long)this->num_class;
              uVar25 = uVar25 + 1) {
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((long)&(bbox_rects.
                                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->xmin +
                          local_190 * uVar25 *
                          (long)bbox_rects.
                                super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)bbox_rects.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
            fVar1 = *(float *)((long)picked.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              uVar14 * 4 +
                              (long)(local_19c * iVar21) *
                              (long)bbox_rects.
                                    super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Mat::~Mat((Mat *)&picked);
            fVar2 = fVar38;
            if (fVar38 <= fVar1) {
              fVar2 = fVar1;
            }
            auVar39 = ZEXT416((uint)fVar2);
            if (fVar38 < fVar1) {
              uVar23 = uVar25 & 0xffffffff;
            }
          }
          auVar40._4_12_ = auVar39._4_12_;
          auVar40._0_4_ = fVar38 / (fVar32 + 1.0);
          in_XMM1 = auVar40;
          confidence = auVar40._0_4_;
          if (this->confidence_threshold <= auVar40._0_4_) {
            fVar30 = (1.0 / (fVar30 + 1.0) + (float)iVar21) * (1.0 / fVar34);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(fVar30 - fVar35,fVar31 - fVar29);
            in_XMM1._4_4_ = extraout_XMM0_Db;
            in_XMM1._0_4_ = fVar37;
            in_XMM1._8_4_ = extraout_XMM0_Dc;
            in_XMM1._12_4_ = extraout_XMM0_Dd;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)CONCAT44(fVar35 + fVar30,fVar37);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44(picked.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   (int)uVar23);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar16 * 6),(value_type *)&picked);
            std::vector<float,_std::allocator<float>_>::push_back
                      (all_box_bbox_scores.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar16,&confidence);
          }
          pBVar24 = (pointer)&pBVar24->ymin;
          pBVar22 = (pointer)&pBVar22->ymin;
          local_100 = (pointer)&local_100->ymin;
          local_108 = (pointer)&local_108->ymin;
          local_110 = (pointer)&local_110->ymin;
        }
      }
      Mat::~Mat((Mat *)&bbox_rects);
      lVar16 = lVar16 + 1;
    }
    lVar16 = 8;
    for (lVar27 = 0;
        pvVar13 = all_box_bbox_scores.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar27 < (int)uVar14;
        lVar27 = lVar27 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar16 + -8),
                 *(BBoxRect **)
                  ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar16));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&all_bbox_scores,
                 (const_iterator)
                 all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pvVar13 + lVar16 + -8),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)
                  ((long)&(pvVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar16));
      uVar14 = (ulong)(uint)this->num_box;
      lVar16 = lVar16 + 0x18;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&all_box_bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)&bbox_scores);
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b=0; b<bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp*2];
            const float bias_h = biases[pp*2+1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p+1);
            const float* wptr = bottom_top_blob.channel(p+2);
            const float* hptr = bottom_top_blob.channel(p+3);

            const float* box_score_ptr = bottom_top_blob.channel(p+4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p+5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / w);
                    float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / h);

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

    //                 fprintf(stderr, "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1);// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}